

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::NodeRef::set_val(NodeRef *this,csubstr val)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  bool bVar5;
  size_t node;
  csubstr cVar6;
  char msg [43];
  size_t local_28;
  
  if (this->m_tree == (Tree *)0x0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '_';
    msg[9] = 'R';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    msg._24_4_ = cVar6.str._0_4_;
    msg._28_4_ = cVar6.str._4_4_;
    msg._32_3_ = (undefined3)cVar6.len;
    msg._35_5_ = cVar6.len._3_5_;
    (*(code *)PTR_error_impl_00231528)
              ("check failed: m_tree != nullptr",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  node = this->m_id;
  if (((node == 0xffffffffffffffff) || ((this->m_seed).str != (char *)0x0)) ||
     ((this->m_seed).len != 0xffffffffffffffff)) {
    builtin_strncpy(msg + 0x20,"is_seed())",0xb);
    builtin_strncpy(msg + 0x10,"_id != NONE && !",0x10);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_tree->m_callbacks).m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_28 = cVar6.len;
    auVar4 = ZEXT1224(ZEXT412(0x525f) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar6.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar6.str._4_4_;
    LVar3.name.len = local_28;
    (*p_Var1)(msg,0x2b,LVar3,(this->m_tree->m_callbacks).m_user_data);
    node = this->m_id;
  }
  Tree::_set_val(this->m_tree,node,val,0);
  return;
}

Assistant:

void set_val(csubstr val) { _C4RV(); m_tree->_set_val(m_id, val); }